

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_ext_tile_info(AV1_COMMON *cm,aom_write_bit_buffer *saved_wb,aom_write_bit_buffer *wb)

{
  uint uVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int mod;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = *(uint *)(in_RDX + 1) & 7;
  if (uVar1 != 0) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)
               (CONCAT44(*(uint *)(in_RDX + 1),in_stack_ffffffffffffffe0) & 0x7ffffffff),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  *in_RSI = *in_RDX;
  in_RSI[1] = in_RDX[1];
  if (1 < *(int *)(in_RDI + 0x60a4) * *(int *)(in_RDI + 0x60a0)) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static inline void write_ext_tile_info(const AV1_COMMON *const cm,
                                       struct aom_write_bit_buffer *saved_wb,
                                       struct aom_write_bit_buffer *wb) {
  // This information is stored as a separate byte.
  int mod = wb->bit_offset % CHAR_BIT;
  if (mod > 0) aom_wb_write_literal(wb, 0, CHAR_BIT - mod);
  assert(aom_wb_is_byte_aligned(wb));

  *saved_wb = *wb;
  if (cm->tiles.rows * cm->tiles.cols > 1) {
    // Note that the last item in the uncompressed header is the data
    // describing tile configuration.
    // Number of bytes in tile column size - 1
    aom_wb_write_literal(wb, 0, 2);
    // Number of bytes in tile size - 1
    aom_wb_write_literal(wb, 0, 2);
  }
}